

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O3

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<unsigned_long>
          (ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
           *this,unsigned_long aValue,unsigned_long aBase,uint8_t aFill)

{
  Iterator pcVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  Iterator pcVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  char tmpBuffer [100];
  
  if (0xfffffffffffffff0 < aBase - 0x11) {
    if (aBase == 0x10) {
      pcVar1 = this->mBegin;
      pcVar5 = this->mEnd;
      if (pcVar1 < pcVar5) {
        *pcVar1 = '0';
        pcVar5 = this->mEnd;
        pcVar1 = this->mBegin + 1;
        this->mBegin = pcVar1;
      }
      if (pcVar1 < pcVar5) {
        *pcVar1 = 'x';
        goto LAB_00103b11;
      }
    }
    else if (aBase != 10) {
      if (aBase == 2) {
        pcVar1 = this->mBegin;
        pcVar5 = this->mEnd;
        if (pcVar1 < pcVar5) {
          *pcVar1 = '0';
          pcVar5 = this->mEnd;
          pcVar1 = this->mBegin + 1;
          this->mBegin = pcVar1;
        }
        if (pcVar1 < pcVar5) {
          *pcVar1 = 'b';
LAB_00103b11:
          this->mBegin = this->mBegin + 1;
        }
      }
      else {
        pcVar1 = this->mBegin;
        pcVar5 = this->mEnd;
        if (pcVar1 < pcVar5) {
          *pcVar1 = '0';
          pcVar5 = this->mEnd;
          pcVar1 = this->mBegin + 1;
          this->mBegin = pcVar1;
        }
        if (pcVar1 < pcVar5) {
          *pcVar1 = '!';
          goto LAB_00103b11;
        }
      }
    }
    uVar6 = 0;
    do {
      uVar7 = uVar6;
      tmpBuffer[uVar7] = "0123456789abcdef"[aValue % aBase];
      uVar6 = uVar7 + 1;
      if (0x62 < uVar7) break;
      bVar8 = aBase <= aValue;
      aValue = aValue / aBase;
    } while (bVar8);
    if (uVar7 < 99) {
      if ((byte)uVar6 < aFill) {
        pcVar2 = this->mBegin;
        if (aFill != (byte)uVar6) {
          uVar4 = aFill - uVar6;
          do {
            if (pcVar2 < this->mEnd) {
              *pcVar2 = '0';
              pcVar2 = this->mBegin + 1;
              this->mBegin = pcVar2;
            }
            bVar3 = (char)uVar4 - 1;
            uVar4 = (ulong)bVar3;
          } while (bVar3 != 0);
        }
      }
      else {
        pcVar2 = this->mBegin;
      }
      if (uVar6 != 1) {
        do {
          uVar6 = uVar7 - 1;
          if (pcVar2 < this->mEnd) {
            *pcVar2 = tmpBuffer[uVar7];
            pcVar2 = this->mBegin + 1;
            this->mBegin = pcVar2;
          }
          uVar7 = uVar6;
        } while ((char)uVar6 != '\0');
      }
      if (this->mEnd <= pcVar2) {
        return;
      }
      *pcVar2 = tmpBuffer[0];
      goto LAB_00103bc3;
    }
  }
  if (this->mEnd <= this->mBegin) {
    return;
  }
  *this->mBegin = '#';
LAB_00103bc3:
  this->mBegin = this->mBegin + 1;
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }